

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

int __thiscall FStateDefinitions::AddStates(FStateDefinitions *this,FState *state,char *framechars)

{
  byte bVar1;
  int iVar2;
  FState *pFVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  
  lVar6 = 0;
  bVar5 = false;
  uVar4 = 0;
  do {
    bVar1 = framechars[lVar6];
    if (bVar1 == 0x23) {
      bVar1 = 2;
    }
    else if (bVar1 == 0x5e) {
      bVar1 = 0;
      uVar4 = 0x1b;
    }
    else {
      if (bVar1 == 0) {
        pFVar3 = (this->StateArray).Array + ((this->StateArray).Count - 1);
        this->laststate = pFVar3;
        this->laststatebeforelabel = pFVar3;
        iVar2 = -(int)lVar6;
        if (!bVar5) {
          iVar2 = (int)lVar6;
        }
        return iVar2;
      }
      uVar4 = (bVar1 & 0xffffffdf) - 0x41;
      bVar1 = 0;
    }
    bVar7 = 0x1c < uVar4;
    if (bVar7) {
      uVar4 = 0;
    }
    bVar5 = (bool)(bVar5 | bVar7);
    state->Frame = (BYTE)uVar4;
    state->field_0x22 = state->field_0x22 & 0xfd | bVar1;
    TArray<FState,_FState>::Push(&this->StateArray,state);
    state->field_0x22 = state->field_0x22 & 0xf7;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

int FStateDefinitions::AddStates(FState *state, const char *framechars)
{
	bool error = false;
	int frame = 0;
	int count = 0;
	while (*framechars)
	{
		bool noframe = false;

		if (*framechars == '#')
			noframe = true;
		else if (*framechars == '^') 
			frame = '\\' - 'A';
		else 
			frame = (*framechars & 223) - 'A';

		framechars++;
		if (frame < 0 || frame > 28)
		{
			frame = 0;
			error = true;
		}

		state->Frame = frame;
		state->SameFrame = noframe;
		StateArray.Push(*state);
		++count;

		// NODELAY flag is not carried past the first state
		state->NoDelay = false;
	}
	laststate = &StateArray[StateArray.Size() - 1];
	laststatebeforelabel = laststate;
	return !error ? count : -count;
}